

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

void wasm::ParamUtils::localizeCallsTo
               (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *callTargets,Module *wasm,PassRunner *runner,
               function<void_(wasm::Function_*)> *onChange)

{
  LocalizerPass local_1a8;
  function<void_(wasm::Function_*)> local_48;
  
  std::function<void_(wasm::Function_*)>::function(&local_48,onChange);
  localizeCallsTo(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std
  ::allocator<wasm::Name>>const&,wasm::Module&,wasm::PassRunner*,std::function<void(wasm::
  Function*)>)::LocalizerPass::LocalizerPass(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std
  ::equal_to<wasm::Name>,std::allocator<wasm::Name>>const&,std::function<void(wasm::Function__>_
            (&local_1a8,callTargets,&local_48);
  Pass::setPassRunner((Pass *)&local_1a8,runner);
  (*local_1a8.
    super_WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>.
    super_Pass._vptr_Pass[2])(&local_1a8,wasm);
  localizeCallsTo::LocalizerPass::~LocalizerPass(&local_1a8);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return;
}

Assistant:

void localizeCallsTo(const std::unordered_set<Name>& callTargets,
                     Module& wasm,
                     PassRunner* runner,
                     std::function<void(Function*)> onChange) {
  struct LocalizerPass : public WalkerPass<PostWalker<LocalizerPass>> {
    bool isFunctionParallel() override { return true; }

    std::unique_ptr<Pass> create() override {
      return std::make_unique<LocalizerPass>(callTargets, onChange);
    }

    const std::unordered_set<Name>& callTargets;
    std::function<void(Function*)> onChange;

    LocalizerPass(const std::unordered_set<Name>& callTargets,
                  std::function<void(Function*)> onChange)
      : callTargets(callTargets), onChange(onChange) {}

    void visitCall(Call* curr) {
      if (!callTargets.count(curr->target)) {
        return;
      }

      ChildLocalizer localizer(
        curr, getFunction(), *getModule(), getPassOptions());
      auto* replacement = localizer.getReplacement();
      if (replacement != curr) {
        replaceCurrent(replacement);
        optimized = true;
        onChange(getFunction());
      }
    }

    bool optimized = false;

    void visitFunction(Function* curr) {
      if (optimized) {
        // Localization can add blocks, which might move pops.
        EHUtils::handleBlockNestedPops(curr, *getModule());
      }
    }
  };

  LocalizerPass(callTargets, onChange).run(runner, &wasm);
}